

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void duckdb::VerifyNotNullConstraint
               (TableCatalogEntry *table,Vector *vector,idx_t count,string *col_name)

{
  ConstraintException *this;
  bool bVar1;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar1 = VectorOperations::HasNull(vector,count);
  if (!bVar1) {
    return;
  }
  this = (ConstraintException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"NOT NULL constraint failed: %s.%s",&local_81);
  ::std::__cxx11::string::string
            ((string *)&local_60,
             (string *)&(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  ::std::__cxx11::string::string((string *)&local_80,(string *)col_name);
  ConstraintException::ConstraintException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_40,&local_60,&local_80);
  __cxa_throw(this,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyNotNullConstraint(TableCatalogEntry &table, Vector &vector, idx_t count, const string &col_name) {
	if (!VectorOperations::HasNull(vector, count)) {
		return;
	}

	throw ConstraintException("NOT NULL constraint failed: %s.%s", table.name, col_name);
}